

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QFileSystemEntry *
QFileSystemEngine::absoluteName(QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *entry)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  int *piVar5;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char> local_98;
  QFileSystemEntry resultingEntry;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QFileSystemEntry::isEmpty(entry);
  if ((bVar3) || (bVar3 = qIsFilenameBroken(entry), bVar3)) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    bVar3 = QFileSystemEntry::isAbsolute(entry);
    if ((!bVar3) || (bVar3 = QFileSystemEntry::isClean(entry), !bVar3)) {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::nativeFilePath((NativePath *)&local_98,entry);
      local_b8.size = 0;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char *)0x0;
      if (((undefined1 *)local_98.size == (undefined1 *)0x0) || (*local_98.ptr != '/')) {
        resultingEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        resultingEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        currentPath();
        QFileSystemEntry::nativeFilePath((NativePath *)&local_d8,&resultingEntry);
        puVar6 = (undefined1 *)local_d8.size;
        local_b8.ptr = (char *)local_d8.ptr;
        local_b8.d = (Data *)local_d8.d;
        local_d8.d = (Data *)0x0;
        local_d8.ptr = (char16_t *)0x0;
        local_b8.size = local_d8.size;
        local_d8.size = 0;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
        QFileSystemEntry::~QFileSystemEntry(&resultingEntry);
      }
      else {
        puVar6 = (undefined1 *)0x0;
      }
      if (((undefined1 *)local_98.size != (undefined1 *)0x0) &&
         (((undefined1 *)local_98.size != (undefined1 *)0x1 ||
          (pcVar4 = QByteArray::data((QByteArray *)&local_98), puVar6 = (undefined1 *)local_b8.size,
          *pcVar4 != '.')))) {
        if ((puVar6 != (undefined1 *)0x0) &&
           (*(char *)((long)local_b8.ptr + (long)(puVar6 + -1)) != '/')) {
          QByteArray::append((QByteArray *)&local_b8,'/');
        }
        QByteArray::append((QByteArray *)&local_b8,(QByteArray *)&local_98);
        puVar6 = (undefined1 *)local_b8.size;
      }
      if ((puVar6 == (undefined1 *)0x1) &&
         (pcVar4 = QByteArray::data((QByteArray *)&local_b8), puVar6 = (undefined1 *)local_b8.size,
         *pcVar4 == '/')) {
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_b8);
      }
      else {
        if (puVar6 == (undefined1 *)0x0) {
          resultingEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemEntry::QFileSystemEntry(&resultingEntry,&local_b8);
          local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemEntry::filePath((QString *)&local_f0,&resultingEntry);
          QDir::cleanPath((QString *)&local_d8,(QString *)&local_f0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
        }
        else {
          cVar1 = *(char *)((long)local_b8.ptr + (long)(puVar6 + -1));
          resultingEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          resultingEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemEntry::QFileSystemEntry(&resultingEntry);
          local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemEntry::filePath((QString *)&local_f0,&resultingEntry);
          QDir::cleanPath((QString *)&local_d8,(QString *)&local_f0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
          if (cVar1 == '/') {
            QString::append((QString *)&local_d8,(QChar)0x2f);
          }
        }
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,(QString *)&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QFileSystemEntry::~QFileSystemEntry(&resultingEntry);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return __return_storage_ptr__;
      }
      goto LAB_00123ab6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
    return __return_storage_ptr__;
  }
LAB_00123ab6:
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::absoluteName(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, entry);

    if (entry.isAbsolute() && entry.isClean())
        return entry;

    QByteArray orig = entry.nativeFilePath();
    QByteArray result;
    if (orig.isEmpty() || !orig.startsWith('/')) {
        QFileSystemEntry cur(currentPath());
        result = cur.nativeFilePath();
    }
    if (!orig.isEmpty() && !(orig.size() == 1 && orig[0] == '.')) {
        if (!result.isEmpty() && !result.endsWith('/'))
            result.append('/');
        result.append(orig);
    }

    if (result.size() == 1 && result[0] == '/')
        return QFileSystemEntry(result, QFileSystemEntry::FromNativePath());
    const bool isDir = result.endsWith('/');

    /* as long as QDir::cleanPath() operates on a QString we have to convert to a string here.
     * ideally we never convert to a string since that loses information. Please fix after
     * we get a QByteArray version of QDir::cleanPath()
     */
    QFileSystemEntry resultingEntry(result, QFileSystemEntry::FromNativePath());
    QString stringVersion = QDir::cleanPath(resultingEntry.filePath());
    if (isDir)
        stringVersion.append(u'/');
    return QFileSystemEntry(stringVersion);
}